

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86.cpp
# Opt level: O2

int __thiscall ncnn::ReLU_x86::forward_inplace(ReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  int iVar3;
  int iVar4;
  int _c;
  int iVar5;
  undefined1 (*pauVar6) [16];
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Mat local_78;
  
  iVar4 = bottom_top_blob->elempack;
  if ((iVar4 == 0) || (iVar3 = (int)bottom_top_blob->elemsize << 3, iVar3 / iVar4 != 8)) {
    iVar3 = bottom_top_blob->c;
    iVar5 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    _c = 0;
    if (iVar4 == 4) {
      if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        for (; _c != iVar3; _c = _c + 1) {
          Mat::channel(&local_78,bottom_top_blob,_c);
          pauVar6 = (undefined1 (*) [16])local_78.data;
          Mat::~Mat(&local_78);
          iVar4 = iVar5;
          while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
            auVar8 = maxps(*pauVar6,ZEXT816(0));
            *pauVar6 = auVar8;
            pauVar6 = pauVar6 + 1;
          }
        }
      }
      else {
        if (iVar5 < 1) {
          iVar5 = _c;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        for (; _c != iVar3; _c = _c + 1) {
          Mat::channel(&local_78,bottom_top_blob,_c);
          pauVar6 = (undefined1 (*) [16])local_78.data;
          Mat::~Mat(&local_78);
          pp_Var2 = this->_vptr_ReLU_x86;
          iVar4 = iVar5;
          while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
            auVar9 = maxps(*pauVar6,ZEXT816(0));
            auVar8 = minps(*pauVar6,ZEXT816(0));
            fVar1 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            *(float *)*pauVar6 = fVar1 * auVar8._0_4_ + auVar9._0_4_;
            *(float *)(*pauVar6 + 4) = fVar1 * auVar8._4_4_ + auVar9._4_4_;
            *(float *)(*pauVar6 + 8) = fVar1 * auVar8._8_4_ + auVar9._8_4_;
            *(float *)(*pauVar6 + 0xc) = fVar1 * auVar8._12_4_ + auVar9._12_4_;
            pauVar6 = pauVar6 + 1;
          }
        }
      }
    }
    else if (*(float *)(&this->field_0xd0 + (long)this->_vptr_ReLU_x86[-3]) == 0.0) {
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; _c != iVar3; _c = _c + 1) {
        Mat::channel(&local_78,bottom_top_blob,_c);
        pauVar6 = (undefined1 (*) [16])local_78.data;
        Mat::~Mat(&local_78);
        for (iVar4 = iVar5; 0 < iVar4; iVar4 = iVar4 + -1) {
          fVar1 = *(float *)*pauVar6;
          if (fVar1 <= 0.0) {
            fVar1 = 0.0;
          }
          *(float *)*pauVar6 = fVar1;
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + 4);
        }
      }
    }
    else {
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; _c != iVar3; _c = _c + 1) {
        Mat::channel(&local_78,bottom_top_blob,_c);
        pauVar6 = (undefined1 (*) [16])local_78.data;
        Mat::~Mat(&local_78);
        pp_Var2 = this->_vptr_ReLU_x86;
        for (iVar4 = iVar5; 0 < iVar4; iVar4 = iVar4 + -1) {
          if (*(float *)*pauVar6 < 0.0) {
            *(float *)*pauVar6 =
                 *(float *)*pauVar6 * *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
          }
          pauVar6 = (undefined1 (*) [16])(*pauVar6 + 4);
        }
      }
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar3 % (long)iVar4 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _zero = _mm256_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, _mm256_max_ps(_zero, _p));
                    ptr += 8;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, lrelu_avx(_p, slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _zero = _mm_set1_ps(0.f);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, _mm_max_ps(_zero, _p));
                    ptr += 4;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, lrelu_sse(_p, slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *ptr = std::max(*ptr, 0.f);

                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                if (*ptr < 0)
                    *ptr *= slope;

                ptr++;
            }
        }
    }

    return 0;
}